

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

PropertyId __thiscall
Js::ScriptContext::GetOrAddPropertyIdTracked
          (ScriptContext *this,LPCWSTR propertyName,int propertyNameLength)

{
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  local_20 = (PropertyRecord *)0x0;
  ThreadContext::GetOrAddPropertyId(this->threadContext,propertyName,propertyNameLength,&local_20);
  if (propertyNameLength == 2) {
    CachePropertyString2(this,local_20);
  }
  TrackPid(this,local_20);
  return local_20->pid;
}

Assistant:

PropertyId ScriptContext::GetOrAddPropertyIdTracked(__in_ecount(propertyNameLength) LPCWSTR propertyName, __in int propertyNameLength)
    {
        Js::PropertyRecord const * propertyRecord = nullptr;
        threadContext->GetOrAddPropertyId(propertyName, propertyNameLength, &propertyRecord);
        if (propertyNameLength == 2)
        {
            CachePropertyString2(propertyRecord);
        }
        this->TrackPid(propertyRecord);

        return propertyRecord->GetPropertyId();
    }